

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiDrawContext::ImGuiDrawContext(ImGuiDrawContext *this)

{
  (this->CursorStartPos).x = 0.0;
  (this->CursorStartPos).y = 0.0;
  (this->CursorMaxPos).x = 0.0;
  (this->CursorMaxPos).y = 0.0;
  (this->CursorPos).x = 0.0;
  (this->CursorPos).y = 0.0;
  (this->CursorPosPrevLine).x = 0.0;
  (this->CursorPosPrevLine).y = 0.0;
  (this->LastItemRect).Min.x = 3.4028235e+38;
  (this->LastItemRect).Min.y = 3.4028235e+38;
  (this->ChildWindows).Size = 0;
  (this->ChildWindows).Capacity = 0;
  (this->ChildWindows).Data = (ImGuiWindow **)0x0;
  (this->ColumnsData).Size = 0;
  (this->ColumnsData).Capacity = 0;
  (this->ColumnsData).Data = (ImGuiColumnData *)0x0;
  this->CurrentLineHeight = 0.0;
  this->CurrentLineTextBaseOffset = 0.0;
  this->PrevLineHeight = 0.0;
  this->PrevLineTextBaseOffset = 0.0;
  (this->ItemWidthStack).Size = 0;
  (this->ItemWidthStack).Capacity = 0;
  (this->ItemWidthStack).Data = (float *)0x0;
  (this->TextWrapPosStack).Size = 0;
  (this->TextWrapPosStack).Capacity = 0;
  (this->TextWrapPosStack).Data = (float *)0x0;
  (this->AllowKeyboardFocusStack).Size = 0;
  (this->AllowKeyboardFocusStack).Capacity = 0;
  (this->AllowKeyboardFocusStack).Data = (bool *)0x0;
  (this->ButtonRepeatStack).Size = 0;
  (this->ButtonRepeatStack).Capacity = 0;
  (this->ButtonRepeatStack).Data = (bool *)0x0;
  (this->GroupStack).Size = 0;
  (this->GroupStack).Capacity = 0;
  (this->GroupStack).Data = (ImGuiGroupData *)0x0;
  this->LogLinePosY = -1.0;
  this->MenuBarOffsetX = 0.0;
  this->TreeDepth = 0;
  this->LastItemId = 0;
  (this->LastItemRect).Min.x = 0.0;
  (this->LastItemRect).Min.y = 0.0;
  *(undefined8 *)((long)&(this->LastItemRect).Min.x + 3) = 0;
  *(undefined8 *)((long)&(this->LastItemRect).Max.x + 3) = 0;
  this->StateStorage = (ImGuiStorage *)0x0;
  this->LayoutType = 0;
  this->ItemWidth = 0.0;
  this->AllowKeyboardFocus = true;
  this->ButtonRepeat = false;
  this->TextWrapPos = -1.0;
  this->ColumnsOffsetX = 0.0;
  this->ColumnsCurrent = 0;
  this->StackSizesBackup[3] = 0;
  this->StackSizesBackup[4] = 0;
  *(undefined8 *)(this->StackSizesBackup + 5) = 0;
  this->ColorEditMode = 0;
  this->StackSizesBackup[0] = 0;
  this->StackSizesBackup[1] = 0;
  this->StackSizesBackup[2] = 0;
  this->ColumnsCount = 1;
  this->ColumnsCellMaxY = 0.0;
  this->ColumnsMinX = 0.0;
  this->ColumnsMaxX = 0.0;
  this->ColumnsStartPosY = 0.0;
  this->ColumnsCellMinY = 0.0;
  this->ColumnsShowBorders = true;
  this->ColumnsSetId = 0;
  return;
}

Assistant:

ImVec2(float _x, float _y) { x = _x; y = _y; }